

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O3

int fmt::internal::CharTraits<char>::format_float<double>
              (char *buffer,size_t size,char *format,uint width,int precision,double value)

{
  int iVar1;
  undefined4 in_register_0000000c;
  ulong uVar2;
  
  uVar2 = CONCAT44(in_register_0000000c,width);
  if (width == 0) {
    if (precision < 0) {
      iVar1 = snprintf(buffer,size,format);
      return iVar1;
    }
    uVar2 = (ulong)(uint)precision;
  }
  else if (-1 < precision) {
    iVar1 = snprintf(buffer,size,format);
    return iVar1;
  }
  iVar1 = snprintf(buffer,size,format,uVar2);
  return iVar1;
}

Assistant:

int fmt::internal::CharTraits<char>::format_float(
    char *buffer, std::size_t size, const char *format,
    unsigned width, int precision, T value) {
  if (width == 0) {
    return precision < 0 ?
        FMT_SNPRINTF(buffer, size, format, value) :
        FMT_SNPRINTF(buffer, size, format, precision, value);
  }
  return precision < 0 ?
      FMT_SNPRINTF(buffer, size, format, width, value) :
      FMT_SNPRINTF(buffer, size, format, width, precision, value);
}